

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

int ffgbcl(fitsfile *fptr,int colnum,char *ttype,char *tunit,char *dtype,long *repeat,double *tscal,
          double *tzero,long *tnull,char *tdisp,int *status)

{
  int iVar1;
  LONGLONG ttnull;
  LONGLONG trepeat;
  
  iVar1 = *status;
  if (iVar1 < 1) {
    ffgbclll(fptr,colnum,ttype,tunit,dtype,&trepeat,tscal,tzero,&ttnull,tdisp,status);
    if (repeat != (long *)0x0) {
      *repeat = trepeat;
    }
    if (tnull != (long *)0x0) {
      *tnull = ttnull;
    }
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int ffgbcl( fitsfile *fptr,   /* I - FITS file pointer                      */
            int  colnum,      /* I - column number                          */
            char *ttype,      /* O - TTYPEn keyword value                   */
            char *tunit,      /* O - TUNITn keyword value                   */
            char *dtype,      /* O - datatype char: I, J, E, D, etc.        */
            long *repeat,     /* O - vector column repeat count             */
            double *tscal,    /* O - TSCALn keyword value                   */
            double *tzero,    /* O - TZEROn keyword value                   */
            long *tnull,      /* O - TNULLn keyword value integer cols only */
            char *tdisp,      /* O - TDISPn keyword value                   */
            int  *status)     /* IO - error status                          */
/*
  get BINTABLE column keyword values
*/
{
    LONGLONG trepeat, ttnull;
    
    if (*status > 0)
        return(*status);

    ffgbclll(fptr, colnum, ttype, tunit, dtype, &trepeat, tscal, tzero,
             &ttnull, tdisp, status);

    if (repeat)
        *repeat = (long) trepeat;

    if (tnull)
        *tnull = (long) ttnull;

    return(*status);
}